

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_2::PolygonOffsetUnitsCase::test(PolygonOffsetUnitsCase *this)

{
  float units;
  int local_54;
  GLfloat reference;
  int i;
  int numIterations;
  int ndx;
  float fixedTests [4];
  undefined1 local_20 [8];
  Random rnd;
  PolygonOffsetUnitsCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)local_20,0xabcdef);
  (*this->m_verifier->_vptr_StateVerifier[2])
            (0,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x2a00);
  ApiCase::expectError(&this->super_ApiCase,0);
  _numIterations = 0x3f00000000000000;
  fixedTests[0] = -0.5;
  fixedTests[1] = 1.5;
  for (i = 0; i < 4; i = i + 1) {
    glu::CallLogWrapper::glPolygonOffset
              (&(this->super_ApiCase).super_CallLogWrapper,0.0,(GLfloat)(&numIterations)[i]);
    (*this->m_verifier->_vptr_StateVerifier[2])
              ((&numIterations)[i],this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x2a00);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  for (local_54 = 0; local_54 < 0x78; local_54 = local_54 + 1) {
    units = de::Random::getFloat((Random *)local_20,-64000.0,64000.0);
    glu::CallLogWrapper::glPolygonOffset(&(this->super_ApiCase).super_CallLogWrapper,0.0,units);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (units,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x2a00);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  de::Random::~Random((Random *)local_20);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		m_verifier->verifyFloat(m_testCtx, GL_POLYGON_OFFSET_UNITS, 0.0f);
		expectError(GL_NO_ERROR);

		const float fixedTests[] =
		{
			0.0f, 0.5f, -0.5f, 1.5f
		};
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(fixedTests); ++ndx)
		{
			glPolygonOffset(0, fixedTests[ndx]);
			m_verifier->verifyFloat(m_testCtx, GL_POLYGON_OFFSET_UNITS, fixedTests[ndx]);
			expectError(GL_NO_ERROR);
		}

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			const GLfloat reference = rnd.getFloat(-64000, 64000);

			glPolygonOffset(0, reference);
			m_verifier->verifyFloat(m_testCtx, GL_POLYGON_OFFSET_UNITS, reference);
			expectError(GL_NO_ERROR);
		}
	}